

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionFreeStr.cpp
# Opt level: O0

void __thiscall
Hpipe::InstructionFreeStr::write_cpp
          (InstructionFreeStr *this,StreamSepMaker *ss,StreamSepMaker *es,CppEmitter *cpp_emitter)

{
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  CppEmitter *local_28;
  CppEmitter *cpp_emitter_local;
  StreamSepMaker *es_local;
  StreamSepMaker *ss_local;
  InstructionFreeStr *this_local;
  
  local_28 = cpp_emitter;
  cpp_emitter_local = (CppEmitter *)es;
  es_local = ss;
  ss_local = (StreamSepMaker *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"data",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"buf",&local_81);
  (*(this->super_Instruction)._vptr_Instruction[0x14])(this,ss,es,cpp_emitter,local_48,local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  Instruction::write_trans(&this->super_Instruction,es_local,local_28,0);
  return;
}

Assistant:

void InstructionFreeStr::write_cpp( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter ) {
    write_cpp_code_seq( ss, es, cpp_emitter );
    write_trans( ss, cpp_emitter );
}